

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall
QPDFWriter::unparseObject
          (QPDFWriter *this,QPDFObjectHandle *object,int level,int flags,size_t stream_length,
          bool compress)

{
  _Rb_tree_node_base *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_type len;
  unique_ptr<char[],_std::default_delete<char[]>_> str;
  bool bVar2;
  qpdf_object_type_e qVar3;
  int iVar4;
  int iVar5;
  QPDFObjGen og;
  uchar *puVar6;
  size_type sVar7;
  iterator iVar8;
  iterator iVar9;
  Object *pOVar10;
  element_type *peVar11;
  longlong lVar12;
  RC4_KEY *key;
  iterator iVar13;
  logic_error *this_01;
  uint *indata;
  Pl_AES_PDF *pPVar14;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  string_view str_21;
  string_view str_22;
  string_view str_23;
  string_view str_24;
  string_view str_25;
  string_view str_26;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  string val;
  Pl_Buffer bufpl;
  RC4 rc4;
  Pl_AES_PDF pl;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp_ph;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  undefined1 local_1a8 [16];
  QPDFObjectHandle extensions;
  string indent;
  QPDFObjectHandle adbe;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130 [8];
  size_type sStack_128;
  string local_120;
  QPDFObjectHandle local_100;
  undefined1 local_f0 [24];
  undefined1 auStack_d8 [8];
  undefined1 local_d0 [32];
  string local_b0;
  size_t local_90;
  _Base_ptr local_88;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_90 = stream_length;
  og = QPDFObjectHandle::getObjGen(object);
  if (level < 0) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"invalid level in QPDFWriter::unparseObject");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&indent," ",(allocator<char> *)&pl);
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      qdf_mode == true) {
    std::__cxx11::string::append((ulong)&indent,(char)level * '\x02');
    *indent._M_dataplus._M_p = '\n';
  }
  qVar3 = QPDFObjectHandle::getTypeCode(object);
  if (qVar3 - ot_string < 5) {
    uVar15 = flags & 0xfffffffe;
    indata = &switchD_001b544d::switchdataD_00229498;
    switch(qVar3) {
    case ot_string:
      val._M_dataplus._M_p = (pointer)&val.field_2;
      val._M_string_length = 0;
      val.field_2._M_local_buf[0] = '\0';
      if ((((flags & 0x14U) == 0) &&
          (peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr, peVar11->encrypted != false)) &&
         ((peVar11->cur_data_key)._M_string_length != 0)) {
        QPDFObjectHandle::getStringValue_abi_cxx11_((string *)&pl,object);
        std::__cxx11::string::operator=((string *)&val,(string *)&pl);
        std::__cxx11::string::~string((string *)&pl);
        if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            encrypt_use_aes == true) {
          Pl_Buffer::Pl_Buffer(&bufpl,"encrypted string",(Pipeline *)0x0);
          puVar6 = QUtil::unsigned_char_pointer
                             (&((this->m).
                                super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->cur_data_key);
          Pl_AES_PDF::Pl_AES_PDF
                    (&pl,"aes encrypt string",&bufpl.super_Pipeline,true,puVar6,
                     (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->cur_data_key)._M_string_length);
          Pipeline::writeString(&pl.super_Pipeline,&val);
          Pl_AES_PDF::finish(&pl);
          Pl_Buffer::getString_abi_cxx11_((string *)(auStack_d8 + 8),&bufpl);
          tmp_ph._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl =
               (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)local_1a8;
          if (local_d0._0_8_ == (long)local_d0 + 0x10) {
            local_1a8._8_8_ = local_d0._24_8_;
          }
          else {
            tmp_ph._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl =
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)local_d0._0_8_;
          }
          local_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_;
          local_d0._8_8_ = (Pipeline *)0x0;
          local_d0[0x10] = 0;
          local_d0._0_8_ = (long)local_d0 + 0x10;
          QPDF_String::unparse_abi_cxx11_((string *)&rc4,(QPDF_String *)&tmp_ph,true);
          std::__cxx11::string::operator=((string *)&val,(string *)&rc4);
          std::__cxx11::string::~string((string *)&rc4);
          std::__cxx11::string::~string((string *)&tmp_ph);
          std::__cxx11::string::~string((string *)(auStack_d8 + 8));
          Pl_AES_PDF::~Pl_AES_PDF(&pl);
          Pl_Buffer::~Pl_Buffer(&bufpl);
        }
        else {
          QUtil::make_unique_cstr((QUtil *)&tmp_ph,&val);
          str = tmp_ph;
          len = val._M_string_length;
          key = (RC4_KEY *)
                QUtil::unsigned_char_pointer
                          (&((this->m).
                             super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->cur_data_key);
          pl.super_Pipeline._vptr_Pipeline =
               (_func_int **)
               (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->cur_data_key)._M_string_length;
          uVar15 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                             ((unsigned_long *)&pl);
          RC4::RC4(&rc4,key,(ulong)uVar15,(uchar *)indata,(uchar *)stream_length);
          puVar6 = QUtil::unsigned_char_pointer
                             ((char *)str._M_t.
                                      super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                                      .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                      super__Head_base<0UL,_char_*,_false>._M_head_impl);
          RC4::process(&rc4,puVar6,len,puVar6);
          local_140._M_allocated_capacity = (size_type)local_130;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,
                     str._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl,
                     len + (long)str._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                 _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                 super__Head_base<0UL,_char_*,_false>._M_head_impl);
          bufpl.super_Pipeline._vptr_Pipeline =
               (_func_int **)&bufpl.super_Pipeline.identifier._M_string_length;
          if ((undefined1 *)local_140._M_allocated_capacity == local_130) {
            bufpl.super_Pipeline.identifier.field_2._M_allocated_capacity = sStack_128;
          }
          else {
            bufpl.super_Pipeline._vptr_Pipeline = (_func_int **)local_140._M_allocated_capacity;
          }
          bufpl.super_Pipeline.identifier._M_dataplus._M_p = (pointer)local_140._8_8_;
          local_140._8_8_ = (pointer)0x0;
          local_130[0] = 0;
          local_140._M_allocated_capacity = (size_type)local_130;
          QPDF_String::unparse_abi_cxx11_((string *)&pl,(QPDF_String *)&bufpl,false);
          std::__cxx11::string::operator=((string *)&val,(string *)&pl);
          std::__cxx11::string::~string((string *)&pl);
          std::__cxx11::string::~string((string *)&bufpl);
          std::__cxx11::string::~string((string *)local_140._M_local_buf);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&tmp_ph);
        }
      }
      else {
        if ((flags & 8U) == 0) {
          QPDFObjectHandle::unparseResolved_abi_cxx11_((string *)&pl,object);
          pPVar14 = &pl;
          std::__cxx11::string::operator=((string *)&val,(string *)pPVar14);
        }
        else {
          QPDFObjectHandle::getStringValue_abi_cxx11_((string *)local_f0,object);
          bufpl.super_Pipeline._vptr_Pipeline =
               (_func_int **)&bufpl.super_Pipeline.identifier._M_string_length;
          if ((undefined1 *)local_f0._0_8_ == local_f0 + 0x10) {
            bufpl.super_Pipeline.identifier.field_2._M_allocated_capacity = (size_type)auStack_d8;
          }
          else {
            bufpl.super_Pipeline._vptr_Pipeline = (_func_int **)local_f0._0_8_;
          }
          bufpl.super_Pipeline.identifier._M_dataplus._M_p = (pointer)local_f0._8_8_;
          local_f0._8_8_ = (pointer)0x0;
          local_f0[0x10] = '\0';
          local_f0._0_8_ = local_f0 + 0x10;
          QPDF_String::unparse_abi_cxx11_((string *)&pl,(QPDF_String *)&bufpl,true);
          std::__cxx11::string::operator=((string *)&val,(string *)&pl);
          std::__cxx11::string::~string((string *)&pl);
          std::__cxx11::string::~string((string *)&bufpl);
          pPVar14 = (Pl_AES_PDF *)local_f0;
        }
        std::__cxx11::string::~string((string *)pPVar14);
      }
      str_10._M_str = val._M_dataplus._M_p;
      str_10._M_len = val._M_string_length;
      writeString(this,str_10);
      pPVar14 = (Pl_AES_PDF *)&val;
      break;
    case ot_name:
      goto switchD_001b544d_caseD_7;
    case ot_array:
      str_00._M_str = "[";
      str_00._M_len = 1;
      writeString(this,str_00);
      ::qpdf::Array::Array((Array *)&pl,(shared_ptr<QPDFObject> *)object);
      iVar8 = ::qpdf::Array::begin((Array *)&pl);
      iVar9 = ::qpdf::Array::end((Array *)&pl);
      for (; iVar8._M_current != iVar9._M_current; iVar8._M_current = iVar8._M_current + 1) {
        str_01._M_str = indent._M_dataplus._M_p;
        str_01._M_len = indent._M_string_length;
        writeString(this,str_01);
        str_02._M_str = "  ";
        str_02._M_len = 2;
        writeStringQDF(this,str_02);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)iVar8._M_current);
        unparseChild(this,(QPDFObjectHandle *)&local_40,level + 1,uVar15);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
      ::qpdf::Array::~Array((Array *)&pl);
      str_04._M_str = indent._M_dataplus._M_p;
      str_04._M_len = indent._M_string_length;
      writeString(this,str_04);
      str_05._M_str = "]";
      str_05._M_len = 1;
      writeString(this,str_05);
      goto LAB_001b6a4a;
    case ot_dictionary:
      QPDFObjectHandle::unsafeShallowCopy((QPDFObjectHandle *)&pl);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)object,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pl);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pl.super_Pipeline.identifier);
      peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      extensions.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      extensions.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((peVar11->root_og).obj == og.obj) && ((peVar11->root_og).gen == og.gen)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pl,"/Extensions",(allocator<char> *)&rc4);
        bVar2 = QPDFObjectHandle::hasKey(object,(string *)&pl);
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&bufpl,"/Extensions",(allocator<char> *)&tmp_ph);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&val,(string *)object);
          bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&val);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&val._M_string_length);
          std::__cxx11::string::~string((string *)&bufpl);
          std::__cxx11::string::~string((string *)&pl);
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pl,"/Extensions",(allocator<char> *)&val);
            QPDFObjectHandle::getKey((QPDFObjectHandle *)&bufpl,(string *)object);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&extensions,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&bufpl);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &bufpl.super_Pipeline.identifier);
            goto LAB_001b56d0;
          }
        }
        else {
LAB_001b56d0:
          std::__cxx11::string::~string((string *)&pl);
        }
        if (extensions.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
           ) {
          bVar16 = false;
          bVar17 = false;
        }
        else {
          QPDFObjectHandle::getKeys_abi_cxx11_
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pl,&extensions);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&bufpl,"/ADBE",(allocator<char> *)&val);
          sVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&pl,(key_type *)&bufpl);
          std::__cxx11::string::~string((string *)&bufpl);
          bVar16 = sVar7 != 0;
          if (bVar16) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&bufpl,"/ADBE",(allocator<char> *)&val);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&pl,(key_type *)&bufpl);
            std::__cxx11::string::~string((string *)&bufpl);
          }
          bVar17 = pl.super_Pipeline.next_ != (Pipeline *)0x0;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&pl);
        }
        if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            final_extension_level < 1) {
          if (!(bool)(bVar17 | bVar16 ^ 1U)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pl,"/Extensions",(allocator<char> *)&bufpl);
            QPDFObjectHandle::removeKey(object,(string *)&pl);
            std::__cxx11::string::~string((string *)&pl);
            pl.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
            pl.super_Pipeline.identifier._M_dataplus._M_p = (pointer)0x0;
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&extensions,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pl);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pl.super_Pipeline.identifier);
          }
          bVar2 = false;
        }
        else {
          bVar2 = true;
          if (!bVar16 && !bVar17) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pl,"/Extensions",(allocator<char> *)&rc4);
            QPDFObjectHandle::newDictionary();
            QPDFObjectHandle::replaceKeyAndGetNew
                      ((QPDFObjectHandle *)&bufpl,(string *)object,(QPDFObjectHandle *)&pl);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&extensions,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&bufpl);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &bufpl.super_Pipeline.identifier);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&val._M_string_length);
            std::__cxx11::string::~string((string *)&pl);
          }
        }
      }
      else {
        bVar2 = 0 < ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->final_extension_level;
      }
      if (extensions.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pl,"/ADBE",(allocator<char> *)&bufpl);
        QPDFObjectHandle::getKey(&adbe,(string *)&extensions);
        std::__cxx11::string::~string((string *)&pl);
        bVar16 = QPDFObjectHandle::isDictionary(&adbe);
        if (bVar16) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pl,"/BaseVersion",(allocator<char> *)&local_100);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&tmp_ph,(string *)&adbe);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufpl
                         ,"/",&((this->m).
                                super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->final_pdf_version);
          bVar16 = QPDFObjectHandle::isNameAndEquals((QPDFObjectHandle *)&tmp_ph,(string *)&bufpl);
          if (!bVar16) {
            std::__cxx11::string::~string((string *)&bufpl);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
            std::__cxx11::string::~string((string *)&pl);
            goto LAB_001b5ffe;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&val,"/ExtensionLevel",&local_2e9);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_120,(string *)&adbe);
          bVar16 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&local_120);
          if (bVar16) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rc4,"/ExtensionLevel",&local_2ea);
            QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_b0,(string *)&adbe);
            lVar12 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_b0);
            bVar16 = lVar12 == ((this->m).
                                super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->final_extension_level;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
            std::__cxx11::string::~string((string *)&rc4);
          }
          else {
            bVar16 = false;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_120._M_string_length);
          std::__cxx11::string::~string((string *)&val);
          std::__cxx11::string::~string((string *)&bufpl);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
          std::__cxx11::string::~string((string *)&pl);
          if (!bVar16) goto LAB_001b5ffe;
        }
        else {
LAB_001b5ffe:
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&pl,"/ADBE",&local_2e9);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tmp_ph,"<< /BaseVersion /",
                           &((this->m).
                             super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->final_pdf_version);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rc4
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &tmp_ph," /ExtensionLevel ");
            std::__cxx11::to_string
                      (&local_120,
                       ((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->final_extension_level);
            std::operator+(&val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&rc4,&local_120);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &bufpl,&val," >>");
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_2ea);
            QPDFObjectHandle::parse(&local_100,(string *)&bufpl,&local_b0);
            QPDFObjectHandle::replaceKey(&extensions,(string *)&pl,&local_100);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_100.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&bufpl);
            std::__cxx11::string::~string((string *)&val);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&rc4);
            std::__cxx11::string::~string((string *)&tmp_ph);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pl,"/ADBE",(allocator<char> *)&bufpl);
            QPDFObjectHandle::removeKey(&extensions,(string *)&pl);
          }
          std::__cxx11::string::~string((string *)&pl);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&adbe.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      if ((flags & 1U) != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pl,"/Length",(allocator<char> *)&bufpl);
        QPDFObjectHandle::removeKey(object,(string *)&pl);
        std::__cxx11::string::~string((string *)&pl);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pl,"/DecodeParms",(allocator<char> *)&tmp_ph);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&val,(string *)object);
        bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&val);
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&bufpl,"/DecodeParms",(allocator<char> *)&local_120);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&rc4,(string *)object);
          iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&rc4);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&bufpl);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&val._M_string_length);
          std::__cxx11::string::~string((string *)&pl);
          if (iVar4 == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pl,"/DecodeParms",(allocator<char> *)&bufpl);
            QPDFObjectHandle::removeKey(object,(string *)&pl);
            goto LAB_001b62c6;
          }
        }
        else {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&val._M_string_length);
LAB_001b62c6:
          std::__cxx11::string::~string((string *)&pl);
        }
        if ((flags & 2U) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pl,"/Filter",(allocator<char> *)&val);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&bufpl,(string *)object);
          std::__cxx11::string::~string((string *)&pl);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pl,"/DecodeParms",(allocator<char> *)&rc4);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&val,(string *)object);
          std::__cxx11::string::~string((string *)&pl);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pl,"/Crypt",(allocator<char> *)&rc4);
          bVar2 = QPDFObjectHandle::isOrHasName((QPDFObjectHandle *)&bufpl,(string *)&pl);
          std::__cxx11::string::~string((string *)&pl);
          if (bVar2) {
            bVar2 = QPDFObjectHandle::isName((QPDFObjectHandle *)&bufpl);
            if (bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&pl,"/Filter",(allocator<char> *)&rc4);
              QPDFObjectHandle::removeKey(object,(string *)&pl);
              std::__cxx11::string::~string((string *)&pl);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&pl,"/DecodeParms",(allocator<char> *)&rc4);
              QPDFObjectHandle::removeKey(object,(string *)&pl);
              std::__cxx11::string::~string((string *)&pl);
            }
            else {
              iVar4 = 0;
              while( true ) {
                iVar5 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&bufpl);
                if (iVar5 <= iVar4) break;
                QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&rc4,(int)&bufpl);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&pl,"/Crypt",(allocator<char> *)&tmp_ph);
                bVar2 = QPDFObjectHandle::isNameAndEquals((QPDFObjectHandle *)&rc4,(string *)&pl);
                std::__cxx11::string::~string((string *)&pl);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&rc4.crypto.
                            super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (bVar2) {
                  QPDFObjectHandle::eraseItem((QPDFObjectHandle *)&bufpl,iVar4);
                  QPDFObjectHandle::eraseItem((QPDFObjectHandle *)&val,iVar4);
                  break;
                }
                iVar4 = iVar4 + 1;
              }
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&val._M_string_length);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bufpl.super_Pipeline.identifier)
          ;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pl,"/Filter",(allocator<char> *)&bufpl);
          QPDFObjectHandle::removeKey(object,(string *)&pl);
          std::__cxx11::string::~string((string *)&pl);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pl,"/DecodeParms",(allocator<char> *)&bufpl);
          QPDFObjectHandle::removeKey(object,(string *)&pl);
          std::__cxx11::string::~string((string *)&pl);
        }
      }
      str_11._M_str = "<<";
      str_11._M_len = 2;
      writeString(this,str_11);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&rc4,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)object);
      iVar13 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&rc4);
      local_88 = (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&rc4);
      for (; iVar13._M_node != local_88;
          iVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar13._M_node)) {
        this_00 = iVar13._M_node + 2;
        bVar2 = ::qpdf::BaseHandle::null((BaseHandle *)this_00);
        if (!bVar2) {
          str_12._M_str = indent._M_dataplus._M_p;
          str_12._M_len = indent._M_string_length;
          writeString(this,str_12);
          str_13._M_str = "  ";
          str_13._M_len = 2;
          writeStringQDF(this,str_13);
          ::qpdf::Name::normalize((string *)&pl,(string *)(iVar13._M_node + 1));
          str_14._M_str = (char *)pl.super_Pipeline._vptr_Pipeline;
          str_14._M_len = (size_t)pl.super_Pipeline.identifier._M_dataplus._M_p;
          writeString(this,str_14);
          std::__cxx11::string::~string((string *)&pl);
          str_15._M_str = " ";
          str_15._M_len = 1;
          writeString(this,str_15);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(iVar13._M_node + 1),"/Contents");
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pl,"/Sig",(allocator<char> *)&tmp_ph);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&bufpl,"",(allocator<char> *)&local_120);
            bVar2 = QPDFObjectHandle::isDictionaryOfType(object,(string *)&pl,(string *)&bufpl);
            if (!bVar2) {
              std::__cxx11::string::~string((string *)&bufpl);
              std::__cxx11::string::~string((string *)&pl);
              goto LAB_001b6884;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&val,"/ByteRange",(allocator<char> *)&local_b0);
            bVar2 = QPDFObjectHandle::hasKey(object,&val);
            std::__cxx11::string::~string((string *)&val);
            std::__cxx11::string::~string((string *)&bufpl);
            std::__cxx11::string::~string((string *)&pl);
            if (!bVar2) goto LAB_001b6884;
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_50,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this_00);
            unparseChild(this,(QPDFObjectHandle *)&local_50,level + 1,uVar15 | 0x18);
            p_Var1 = &local_50;
          }
          else {
LAB_001b6884:
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this_00);
            unparseChild(this,(QPDFObjectHandle *)&local_60,level + 1,uVar15);
            p_Var1 = &local_60;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if ((flags & 1U) != 0) {
        str_16._M_str = indent._M_dataplus._M_p;
        str_16._M_len = indent._M_string_length;
        writeString(this,str_16);
        str_17._M_str = "  ";
        str_17._M_len = 2;
        writeStringQDF(this,str_17);
        str_18._M_str = "/Length ";
        str_18._M_len = 8;
        writeString(this,str_18);
        peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (peVar11->direct_stream_lengths == true) {
          std::__cxx11::to_string((string *)&pl,local_90);
          str_19._M_str = (char *)pl.super_Pipeline._vptr_Pipeline;
          str_19._M_len = (size_t)pl.super_Pipeline.identifier._M_dataplus._M_p;
          writeString(this,str_19);
          std::__cxx11::string::~string((string *)&pl);
        }
        else {
          std::__cxx11::to_string((string *)&pl,peVar11->cur_stream_length_id);
          str_20._M_str = (char *)pl.super_Pipeline._vptr_Pipeline;
          str_20._M_len = (size_t)pl.super_Pipeline.identifier._M_dataplus._M_p;
          writeString(this,str_20);
          std::__cxx11::string::~string((string *)&pl);
          str_21._M_str = " 0 R";
          str_21._M_len = 4;
          writeString(this,str_21);
        }
        if (compress && (flags & 2U) != 0) {
          str_22._M_str = indent._M_dataplus._M_p;
          str_22._M_len = indent._M_string_length;
          writeString(this,str_22);
          str_23._M_str = "  ";
          str_23._M_len = 2;
          writeStringQDF(this,str_23);
          str_24._M_str = "/Filter /FlateDecode";
          str_24._M_len = 0x14;
          writeString(this,str_24);
        }
      }
      str_25._M_str = indent._M_dataplus._M_p;
      str_25._M_len = indent._M_string_length;
      writeString(this,str_25);
      str_26._M_str = ">>";
      str_26._M_len = 2;
      writeString(this,str_26);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&extensions.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      goto LAB_001b6a4a;
    case ot_stream:
      peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (peVar11->direct_stream_lengths == false) {
        pOVar10 = ObjTable<QPDFWriter::Object>::operator[]
                            (&(peVar11->obj).super_ObjTable<QPDFWriter::Object>,og);
        ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cur_stream_length_id = pOVar10->renumber + 1;
      }
      rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 0;
      tmp_ph._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
           ((ulong)tmp_ph._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl & 0xffffffffffffff00);
      pl.super_Pipeline._vptr_Pipeline =
           (_func_int **)&pl.super_Pipeline.identifier._M_string_length;
      pl.super_Pipeline.identifier._M_dataplus._M_p = (pointer)0x0;
      pl.super_Pipeline.identifier._M_string_length._0_1_ = 0;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)object);
      bVar2 = willFilterStream(this,(QPDFObjectHandle *)&local_70,(bool *)&rc4,(bool *)&tmp_ph,
                               (string *)&pl);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      QPDFObjectHandle::getDict((QPDFObjectHandle *)&bufpl);
      peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      peVar11->cur_stream_length = (size_t)pl.super_Pipeline.identifier._M_dataplus._M_p;
      if ((((char)tmp_ph._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl == '\x01') &&
          (peVar11->encrypted == true)) && (peVar11->encrypt_metadata == false)) {
        (peVar11->cur_data_key)._M_string_length = 0;
        *(peVar11->cur_data_key)._M_dataplus._M_p = '\0';
        peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      }
      adjustAESStreamLength(this,&peVar11->cur_stream_length);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&bufpl);
      unparseObject(this,(QPDFObjectHandle *)&local_80,0,(uint)bVar2 * 2 | flags | 1,
                    ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->cur_stream_length,
                    (bool)rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr._0_1_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      if (pl.super_Pipeline.identifier._M_dataplus._M_p == (pointer)0x0) {
        bVar2 = true;
      }
      else {
        bVar2 = pl.super_Pipeline.identifier._M_dataplus._M_p
                [(long)pl.super_Pipeline._vptr_Pipeline + -1] != '\n';
      }
      str_06._M_str = "\nstream\n";
      str_06._M_len = 8;
      writeString(this,str_06);
      val._M_string_length = 0;
      val._M_dataplus._M_p = (pointer)this;
      pushEncryptionFilter(this,(PipelinePopper *)&val);
      str_07._M_str = (char *)pl.super_Pipeline._vptr_Pipeline;
      str_07._M_len = (size_t)pl.super_Pipeline.identifier._M_dataplus._M_p;
      writeString(this,str_07);
      PipelinePopper::~PipelinePopper((PipelinePopper *)&val);
      peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if ((peVar11->newline_before_endstream == false) && ((bVar2 & peVar11->qdf_mode) != 1)) {
        bVar2 = false;
      }
      else {
        str_08._M_str = "\n";
        str_08._M_len = 1;
        writeString(this,str_08);
        peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        bVar2 = true;
      }
      peVar11->added_newline = bVar2;
      str_09._M_str = "endstream";
      str_09._M_len = 9;
      writeString(this,str_09);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bufpl.super_Pipeline.identifier);
      goto LAB_001b5b7b;
    }
  }
  else {
switchD_001b544d_caseD_7:
    QPDFObjectHandle::unparseResolved_abi_cxx11_((string *)&pl,object);
    str_03._M_str = (char *)pl.super_Pipeline._vptr_Pipeline;
    str_03._M_len = (size_t)pl.super_Pipeline.identifier._M_dataplus._M_p;
    writeString(this,str_03);
LAB_001b5b7b:
    pPVar14 = &pl;
  }
  std::__cxx11::string::~string((string *)pPVar14);
LAB_001b6a4a:
  std::__cxx11::string::~string((string *)&indent);
  return;
}

Assistant:

void
QPDFWriter::unparseObject(
    QPDFObjectHandle object, int level, int flags, size_t stream_length, bool compress)
{
    QPDFObjGen old_og = object.getObjGen();
    int child_flags = flags & ~f_stream;
    if (level < 0) {
        throw std::logic_error("invalid level in QPDFWriter::unparseObject");
    }
    // For non-qdf, "indent" is a single space between tokens. For qdf, indent includes the
    // preceding newline.
    std::string indent = " ";
    if (m->qdf_mode) {
        indent.append(static_cast<size_t>(2 * level), ' ');
        indent[0] = '\n';
    }

    if (auto const tc = object.getTypeCode(); tc == ::ot_array) {
        // Note: PDF spec 1.4 implementation note 121 states that Acrobat requires a space after the
        // [ in the /H key of the linearization parameter dictionary.  We'll do this unconditionally
        // for all arrays because it looks nicer and doesn't make the files that much bigger.
        writeString("[");
        for (auto const& item: object.as_array()) {
            writeString(indent);
            writeStringQDF("  ");
            unparseChild(item, level + 1, child_flags);
        }
        writeString(indent);
        writeString("]");
    } else if (tc == ::ot_dictionary) {
        // Make a shallow copy of this object so we can modify it safely without affecting the
        // original. This code has logic to skip certain keys in agreement with prepareFileForWrite
        // and with skip_stream_parameters so that replacing them doesn't leave unreferenced objects
        // in the output. We can use unsafeShallowCopy here because all we are doing is removing or
        // replacing top-level keys.
        object = object.unsafeShallowCopy();

        // Handle special cases for specific dictionaries.

        // Extensions dictionaries.

        // We have one of several cases:
        //
        // * We need ADBE
        //    - We already have Extensions
        //       - If it has the right ADBE, preserve it
        //       - Otherwise, replace ADBE
        //    - We don't have Extensions: create one from scratch
        // * We don't want ADBE
        //    - We already have Extensions
        //       - If it only has ADBE, remove it
        //       - If it has other things, keep those and remove ADBE
        //    - We have no extensions: no action required
        //
        // Before writing, we guarantee that /Extensions, if present, is direct through the ADBE
        // dictionary, so we can modify in place.

        const bool is_root = (old_og == m->root_og);
        bool have_extensions_other = false;
        bool have_extensions_adbe = false;

        QPDFObjectHandle extensions;
        if (is_root) {
            if (object.hasKey("/Extensions") && object.getKey("/Extensions").isDictionary()) {
                extensions = object.getKey("/Extensions");
            }
        }

        if (extensions) {
            std::set<std::string> keys = extensions.getKeys();
            if (keys.count("/ADBE") > 0) {
                have_extensions_adbe = true;
                keys.erase("/ADBE");
            }
            if (keys.size() > 0) {
                have_extensions_other = true;
            }
        }

        bool need_extensions_adbe = (m->final_extension_level > 0);

        if (is_root) {
            if (need_extensions_adbe) {
                if (!(have_extensions_other || have_extensions_adbe)) {
                    // We need Extensions and don't have it.  Create it here.
                    QTC::TC("qpdf", "QPDFWriter create Extensions", m->qdf_mode ? 0 : 1);
                    extensions = object.replaceKeyAndGetNew(
                        "/Extensions", QPDFObjectHandle::newDictionary());
                }
            } else if (!have_extensions_other) {
                // We have Extensions dictionary and don't want one.
                if (have_extensions_adbe) {
                    QTC::TC("qpdf", "QPDFWriter remove existing Extensions");
                    object.removeKey("/Extensions");
                    extensions = QPDFObjectHandle(); // uninitialized
                }
            }
        }

        if (extensions) {
            QTC::TC("qpdf", "QPDFWriter preserve Extensions");
            QPDFObjectHandle adbe = extensions.getKey("/ADBE");
            if (adbe.isDictionary() &&
                adbe.getKey("/BaseVersion").isNameAndEquals("/" + m->final_pdf_version) &&
                adbe.getKey("/ExtensionLevel").isInteger() &&
                (adbe.getKey("/ExtensionLevel").getIntValue() == m->final_extension_level)) {
                QTC::TC("qpdf", "QPDFWriter preserve ADBE");
            } else {
                if (need_extensions_adbe) {
                    extensions.replaceKey(
                        "/ADBE",
                        QPDFObjectHandle::parse(
                            "<< /BaseVersion /" + m->final_pdf_version + " /ExtensionLevel " +
                            std::to_string(m->final_extension_level) + " >>"));
                } else {
                    QTC::TC("qpdf", "QPDFWriter remove ADBE");
                    extensions.removeKey("/ADBE");
                }
            }
        }

        // Stream dictionaries.

        if (flags & f_stream) {
            // Suppress /Length since we will write it manually
            object.removeKey("/Length");

            // If /DecodeParms is an empty list, remove it.
            if (object.getKey("/DecodeParms").isArray() &&
                (0 == object.getKey("/DecodeParms").getArrayNItems())) {
                QTC::TC("qpdf", "QPDFWriter remove empty DecodeParms");
                object.removeKey("/DecodeParms");
            }

            if (flags & f_filtered) {
                // We will supply our own filter and decode
                // parameters.
                object.removeKey("/Filter");
                object.removeKey("/DecodeParms");
            } else {
                // Make sure, no matter what else we have, that we don't have /Crypt in the output
                // filters.
                QPDFObjectHandle filter = object.getKey("/Filter");
                QPDFObjectHandle decode_parms = object.getKey("/DecodeParms");
                if (filter.isOrHasName("/Crypt")) {
                    if (filter.isName()) {
                        object.removeKey("/Filter");
                        object.removeKey("/DecodeParms");
                    } else {
                        int idx = -1;
                        for (int i = 0; i < filter.getArrayNItems(); ++i) {
                            QPDFObjectHandle item = filter.getArrayItem(i);
                            if (item.isNameAndEquals("/Crypt")) {
                                idx = i;
                                break;
                            }
                        }
                        if (idx >= 0) {
                            // If filter is an array, then the code in QPDF_Stream has already
                            // verified that DecodeParms and Filters are arrays of the same length,
                            // but if they weren't for some reason, eraseItem does type and bounds
                            // checking.
                            QTC::TC("qpdf", "QPDFWriter remove Crypt");
                            filter.eraseItem(idx);
                            decode_parms.eraseItem(idx);
                        }
                    }
                }
            }
        }

        writeString("<<");

        for (auto const& [key, value]: object.as_dictionary()) {
            if (!value.null()) {
                writeString(indent);
                writeStringQDF("  ");
                writeString(Name::normalize(key));
                writeString(" ");
                if (key == "/Contents" && object.isDictionaryOfType("/Sig") &&
                    object.hasKey("/ByteRange")) {
                    QTC::TC("qpdf", "QPDFWriter no encryption sig contents");
                    unparseChild(value, level + 1, child_flags | f_hex_string | f_no_encryption);
                } else {
                    unparseChild(value, level + 1, child_flags);
                }
            }
        }

        if (flags & f_stream) {
            writeString(indent);
            writeStringQDF("  ");
            writeString("/Length ");

            if (m->direct_stream_lengths) {
                writeString(std::to_string(stream_length));
            } else {
                writeString(std::to_string(m->cur_stream_length_id));
                writeString(" 0 R");
            }
            if (compress && (flags & f_filtered)) {
                writeString(indent);
                writeStringQDF("  ");
                writeString("/Filter /FlateDecode");
            }
        }

        writeString(indent);
        writeString(">>");
    } else if (tc == ::ot_stream) {
        // Write stream data to a buffer.
        if (!m->direct_stream_lengths) {
            m->cur_stream_length_id = m->obj[old_og].renumber + 1;
        }

        flags |= f_stream;
        bool compress_stream = false;
        bool is_metadata = false;
        std::string stream_data;
        if (willFilterStream(object, compress_stream, is_metadata, &stream_data)) {
            flags |= f_filtered;
        }
        QPDFObjectHandle stream_dict = object.getDict();

        m->cur_stream_length = stream_data.size();
        if (is_metadata && m->encrypted && (!m->encrypt_metadata)) {
            // Don't encrypt stream data for the metadata stream
            m->cur_data_key.clear();
        }
        adjustAESStreamLength(m->cur_stream_length);
        unparseObject(stream_dict, 0, flags, m->cur_stream_length, compress_stream);
        char last_char = stream_data.empty() ? '\0' : stream_data.back();
        writeString("\nstream\n");
        {
            PipelinePopper pp_enc(this);
            pushEncryptionFilter(pp_enc);
            writeString(stream_data);
        }

        if (m->newline_before_endstream || (m->qdf_mode && last_char != '\n')) {
            writeString("\n");
            m->added_newline = true;
        } else {
            m->added_newline = false;
        }
        writeString("endstream");
    } else if (tc == ::ot_string) {
        std::string val;
        if (m->encrypted && (!(flags & f_in_ostream)) && (!(flags & f_no_encryption)) &&
            (!m->cur_data_key.empty())) {
            val = object.getStringValue();
            if (m->encrypt_use_aes) {
                Pl_Buffer bufpl("encrypted string");
                Pl_AES_PDF pl(
                    "aes encrypt string",
                    &bufpl,
                    true,
                    QUtil::unsigned_char_pointer(m->cur_data_key),
                    m->cur_data_key.length());
                pl.writeString(val);
                pl.finish();
                val = QPDF_String(bufpl.getString()).unparse(true);
            } else {
                auto tmp_ph = QUtil::make_unique_cstr(val);
                char* tmp = tmp_ph.get();
                size_t vlen = val.length();
                RC4 rc4(
                    QUtil::unsigned_char_pointer(m->cur_data_key),
                    QIntC::to_int(m->cur_data_key.length()));
                auto data = QUtil::unsigned_char_pointer(tmp);
                rc4.process(data, vlen, data);
                val = QPDF_String(std::string(tmp, vlen)).unparse();
            }
        } else if (flags & f_hex_string) {
            val = QPDF_String(object.getStringValue()).unparse(true);
        } else {
            val = object.unparseResolved();
        }
        writeString(val);
    } else {
        writeString(object.unparseResolved());
    }
}